

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdGetTaprootScriptTreeHash
              (void *handle,void *tree_handle,char *internal_pubkey,char **hash,char **tap_leaf_hash
              ,char **control_block)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Script *pSVar2;
  TapBranch *object;
  TaprootScriptTree *this;
  bool bVar3;
  CfdException *this_00;
  char *work_control_block;
  char *work_tap_leaf_hash;
  char *work_hash;
  SchnorrPubkey tapscript_hash;
  ByteData control;
  TapBranch branch;
  allocator local_131;
  void *local_130;
  string local_128;
  char *local_108;
  char *local_100;
  char *local_f8;
  SchnorrPubkey local_f0;
  SchnorrPubkey local_d8;
  ByteData local_c0;
  TapBranch local_a8;
  
  local_f8 = (char *)0x0;
  local_100 = (char *)0x0;
  local_108 = (char *)0x0;
  local_130 = handle;
  cfd::Initialize();
  pSVar2 = &local_a8.script_;
  local_a8._vptr_TapBranch = (_func_int **)pSVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_a8);
  if ((Script *)local_a8._vptr_TapBranch != pSVar2) {
    operator_delete(local_a8._vptr_TapBranch);
  }
  bVar3 = cfd::capi::IsEmptyString(internal_pubkey);
  if (!bVar3) {
    cfd::core::TapBranch::TapBranch(&local_a8);
    object = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
    if (object == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
      this = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
      if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      if (tap_leaf_hash != (char **)0x0) {
        cfd::core::TaprootScriptTree::GetTapLeafHash(&local_f0.data_,this);
        cfd::core::ByteData256::GetHex_abi_cxx11_(&local_128,&local_f0.data_);
        local_100 = cfd::capi::CreateString(&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      cfd::core::TapBranch::operator=(&local_a8,(TapBranch *)this);
    }
    else {
      cfd::core::TapBranch::operator=(&local_a8,object);
    }
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_f0);
    std::__cxx11::string::string((string *)&local_128,internal_pubkey,&local_131);
    cfd::core::SchnorrPubkey::SchnorrPubkey(&local_d8,&local_128);
    cfd::core::TaprootUtil::CreateTapScriptControl
              (&local_c0,&local_d8,&local_a8,&local_f0,(Script *)0x0);
    if (local_d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    paVar1 = &local_128.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (hash != (char **)0x0) {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_128,&local_f0);
      local_f8 = cfd::capi::CreateString(&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p);
      }
    }
    if (control_block != (char **)0x0) {
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_128,&local_c0);
      local_108 = cfd::capi::CreateString(&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p);
      }
    }
    if (hash != (char **)0x0) {
      *hash = local_f8;
    }
    if (local_100 != (char *)0x0 && tap_leaf_hash != (char **)0x0) {
      *tap_leaf_hash = local_100;
    }
    if (control_block != (char **)0x0) {
      *control_block = local_108;
    }
    if (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::TapBranch::~TapBranch(&local_a8);
    return 0;
  }
  local_a8._vptr_TapBranch = (_func_int **)0x5f3330;
  local_a8.has_leaf_ = true;
  local_a8.leaf_version_ = '\x04';
  local_a8._10_2_ = 0;
  local_a8.script_._vptr_Script = (_func_int **)0x5f38a6;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"internal_pubkey is null or empty.")
  ;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8._vptr_TapBranch = (_func_int **)pSVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Failed to parameter. internal_pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_a8);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTaprootScriptTreeHash(
    void* handle, void* tree_handle, const char* internal_pubkey, char** hash,
    char** tap_leaf_hash, char** control_block) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_hash = nullptr;
  char* work_tap_leaf_hash = nullptr;
  char* work_control_block = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (IsEmptyString(internal_pubkey)) {
      warn(CFD_LOG_SOURCE, "internal_pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. internal_pubkey is null or empty.");
    }
    TapBranch branch;
    if (!buffer->branch_buffer->empty()) {
      branch = buffer->branch_buffer->at(0);
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      branch = tree;
    }
    SchnorrPubkey tapscript_hash;
    auto control = TaprootUtil::CreateTapScriptControl(
        SchnorrPubkey(internal_pubkey), branch, &tapscript_hash);

    if (hash != nullptr) {
      work_hash = CreateString(tapscript_hash.GetHex());
    }
    if (control_block != nullptr) {
      work_control_block = CreateString(control.GetHex());
    }

    if (hash != nullptr) *hash = work_hash;
    if ((tap_leaf_hash != nullptr) && (work_tap_leaf_hash != nullptr)) {
      *tap_leaf_hash = work_tap_leaf_hash;
    }
    if (control_block != nullptr) *control_block = work_control_block;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_hash, &work_tap_leaf_hash, &work_control_block);
  return result;
}